

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O0

int nacm_cardinality(lys_ext_instance *ext)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  void *__ptr;
  char *path;
  uint8_t c;
  uint8_t i;
  uint8_t extsize;
  lys_ext_instance **extlist;
  lys_ext_instance *ext_local;
  
  if ((ext->flags & 0x100) == 0) {
    lVar2 = *(long *)((long)ext->parent + 0x20);
    bVar1 = *(byte *)((long)ext->parent + 0x1a);
    path._5_1_ = 0;
    for (path._6_1_ = 0; path._6_1_ < bVar1; path._6_1_ = path._6_1_ + 1) {
      if ((lys_ext *)**(long **)(lVar2 + (ulong)path._6_1_ * 8) == ext->def) {
        if (*(lys_ext_instance **)(lVar2 + (ulong)path._6_1_ * 8) != ext) {
          lVar3 = *(long *)(lVar2 + (ulong)path._6_1_ * 8);
          *(ushort *)(lVar3 + 0x18) = *(ushort *)(lVar3 + 0x18) | 0x100;
        }
        path._5_1_ = path._5_1_ + 1;
      }
    }
    if (path._5_1_ < 2) {
      ext_local._4_4_ = 0;
    }
    else {
      __ptr = (void *)lys_path(ext->parent);
      lyext_log(0,"NACM","nacm_cardinality",
                "Extension nacm:%s can appear only once, but %d instances found in %s.",
                ext->def->name,path._5_1_,__ptr);
      free(__ptr);
      ext_local._4_4_ = 1;
    }
  }
  else {
    ext->flags = ext->flags & 0xfeff;
    ext_local._4_4_ = 0;
  }
  return ext_local._4_4_;
}

Assistant:

int
nacm_cardinality(struct lys_ext_instance *ext)
{
    struct lys_ext_instance **extlist;
    uint8_t extsize, i, c;
    char *path;

    if (ext->flags & LYEXT_OPT_PLUGIN1) {
        /* already checked */
        ext->flags &= ~LYEXT_OPT_PLUGIN1;
        return 0;
    }

    extlist = ((struct lys_node *)ext->parent)->ext;
    extsize = ((struct lys_node *)ext->parent)->ext_size;

    for (i = c = 0; i < extsize; i++) {
        if (extlist[i]->def == ext->def) {
            /* note, that it is not necessary to check also ext->insubstmt since
             * nacm_position() ensures that NACM's extension instances are placed only
             * in schema nodes */
            if (extlist[i] != ext) {
                /* do not mark the instance being checked */
                extlist[i]->flags |= LYEXT_OPT_PLUGIN1;
            }
            c++;
        }
    }

    if (c > 1) {
        path = lys_path((struct lys_node *)(ext->parent));
        LYEXT_LOG(LY_LLERR, "NACM", "Extension nacm:%s can appear only once, but %d instances found in %s.",
                  ext->def->name, c, path);
        free(path);
        return 1;
    } else {
        return 0;
    }
}